

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O1

int getopt_long(int argc,char **argv,char *optstring,option *longopts,int *longindex)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  option *poVar6;
  char *__s1;
  option *poVar7;
  long lVar8;
  uint uVar9;
  
  optarg = (char *)0x0;
  optopt = 0;
  iVar3 = -1;
  if (optind < argc) {
    pcVar5 = argv[optind];
    sVar4 = strlen(pcVar5);
    if ((sVar4 < 3) || (iVar3 = strncmp(pcVar5,"--",2), iVar3 != 0)) {
      iVar3 = getopt(argc,argv,optstring);
      return iVar3;
    }
    sVar4 = strcspn(pcVar5 + 2,"=");
    __s1 = longopts->name;
    uVar9 = 0;
    if (__s1 == (char *)0x0) {
      poVar7 = (option *)0x0;
    }
    else {
      poVar7 = (option *)0x0;
      poVar6 = longopts;
      do {
        iVar3 = strncmp(__s1,pcVar5 + 2,sVar4);
        if (iVar3 == 0) {
          poVar7 = poVar6;
        }
        uVar9 = uVar9 + (iVar3 == 0);
        __s1 = poVar6[1].name;
        poVar6 = poVar6 + 1;
      } while (__s1 != (char *)0x0);
      uVar9 = (uint)(uVar9 == 1);
    }
    iVar3 = 0x3f;
    if ((char)uVar9 != '\0') {
      if (longindex != (int *)0x0) {
        *longindex = (int)((ulong)((long)poVar7 - (long)longopts) >> 5);
      }
      iVar3 = poVar7->val;
      if (poVar7->flag != (int *)0x0) {
        *poVar7->flag = iVar3;
        iVar3 = 0;
      }
      iVar2 = optind;
      iVar1 = poVar7->has_arg;
      lVar8 = (long)optind;
      pcVar5 = strchr(argv[lVar8],0x3d);
      if (iVar1 == 0) {
        if (pcVar5 != (char *)0x0) {
          iVar3 = 0x3f;
        }
      }
      else {
        optarg = pcVar5 + 1;
        if (pcVar5 == (char *)0x0) {
          optarg = (char *)0x0;
        }
        if (iVar1 == 1) {
          if ((pcVar5 == (char *)0x0) && (optind = iVar2 + 1, optind < argc)) {
            optarg = argv[lVar8 + 1];
          }
          if (optarg == (char *)0x0) {
            iVar3 = 0x3a;
          }
        }
      }
    }
    optind = optind + 1;
  }
  return iVar3;
}

Assistant:

int getopt_long(int argc, char* const argv[], const char* optstring,
  const struct option* longopts, int* longindex) {
  const struct option* o = longopts;
  const struct option* match = NULL;
  int num_matches = 0;
  size_t argument_name_length = 0;
  const char* current_argument = NULL;
  int retval = -1;

  optarg = NULL;
  optopt = 0;

  if (optind >= argc)
    return -1;

  if (strlen(argv[optind]) < 3 || strncmp(argv[optind], "--", 2) != 0)
    return getopt(argc, argv, optstring);

  /* It's an option; starts with -- and is longer than two chars. */
  current_argument = argv[optind] + 2;
  argument_name_length = strcspn(current_argument, "=");
  for (; o->name; ++o) {
    if (strncmp(o->name, current_argument, argument_name_length) == 0) {
      match = o;
      ++num_matches;
    }
  }

  if (num_matches == 1) {
    /* If longindex is not NULL, it points to a variable which is set to the
       index of the long option relative to longopts. */
    if (longindex)
      *longindex = (int) (match - longopts);

    /* If flag is NULL, then getopt_long() shall return val.
       Otherwise, getopt_long() returns 0, and flag shall point to a variable
       which shall be set to val if the option is found, but left unchanged if
       the option is not found. */
    if (match->flag)
      *(match->flag) = match->val;

    retval = match->flag ? 0 : match->val;

    if (match->has_arg != no_argument) {
      optarg = strchr(argv[optind], '=');
      if (optarg != NULL)
        ++optarg;

      if (match->has_arg == required_argument) {
        /* Only scan the next argv for required arguments. Behavior is not
           specified, but has been observed with Ubuntu and Mac OSX. */
        if (optarg == NULL && ++optind < argc) {
          optarg = argv[optind];
        }

        if (optarg == NULL)
          retval = ':';
      }
    } else if (strchr(argv[optind], '=')) {
      /* An argument was provided to a non-argument option.
         I haven't seen this specified explicitly, but both GNU and BSD-based
         implementations show this behavior.
      */
      retval = '?';
    }
  } else {
    /* Unknown option or ambiguous match. */
    retval = '?';
  }

  ++optind;
  return retval;
}